

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeMemAllocDevice
          (ze_context_handle_t hContext,ze_device_mem_alloc_desc_t *device_desc,size_t size,
          size_t alignment,ze_device_handle_t hDevice,void **pptr)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ze_result_t unaff_EBP;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ze_result_t local_b4;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zeMemAllocDevice(hContext, device_desc, size, alignment, hDevice, pptr)","");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 0x3c0);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar8 = lVar4 - lVar2 >> 3;
    bVar9 = lVar4 != lVar2;
    local_b4 = unaff_EBP;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        local_b4 = (**(code **)(*plVar5 + 0x5b0))
                             (plVar5,hContext,device_desc,size,alignment,hDevice,pptr);
        if (local_b4 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeMemAllocDevice",local_b4);
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
        local_b4 = unaff_EBP;
      } while (lVar1 != 0);
    }
    if (bVar9) {
      return local_b4;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZEHandleLifetimeValidation::zeMemAllocDevicePrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,device_desc,
                           size,alignment,hDevice,pptr), zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeMemAllocDevice",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hContext,device_desc,size,alignment,hDevice,pptr);
    bVar9 = lVar4 != lVar2;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        result = (**(code **)(*plVar5 + 0x5b8))
                           (plVar5,hContext,device_desc,size,alignment,hDevice,pptr,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeMemAllocDevice",result);
          local_b4 = result;
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar2 = uVar7 + (-(ulong)(uVar8 == 0) - uVar8);
        uVar7 = uVar7 + 1;
      } while (lVar2 != 0);
    }
    if (bVar9) {
      return local_b4;
    }
  }
  logAndPropagateResult("zeMemAllocDevice",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemAllocDevice(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_device_mem_alloc_desc_t* device_desc,  ///< [in] pointer to device memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        void** pptr                                     ///< [out] pointer to device allocation
        )
    {
        context.logger->log_trace("zeMemAllocDevice(hContext, device_desc, size, alignment, hDevice, pptr)");

        auto pfnAllocDevice = context.zeDdiTable.Mem.pfnAllocDevice;

        if( nullptr == pfnAllocDevice )
            return logAndPropagateResult("zeMemAllocDevice", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemAllocDevicePrologue( hContext, device_desc, size, alignment, hDevice, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocDevice", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeMemAllocDevicePrologue( hContext, device_desc, size, alignment, hDevice, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocDevice", result);
        }

        auto driver_result = pfnAllocDevice( hContext, device_desc, size, alignment, hDevice, pptr );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemAllocDeviceEpilogue( hContext, device_desc, size, alignment, hDevice, pptr ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocDevice", result);
        }

        return logAndPropagateResult("zeMemAllocDevice", driver_result);
    }